

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_chorba_c.c
# Opt level: O2

uint32_t crc32_chorba_small_nondestructive_32bit(uint32_t crc,uint32_t *buf,size_t len)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint32_t final [20];
  uint local_c0;
  uint local_bc;
  uint local_a8;
  uint local_a4;
  uint local_88 [22];
  
  local_88[0x10] = 0;
  local_88[0x11] = 0;
  local_88[0x12] = 0;
  local_88[0x13] = 0;
  local_88[0xc] = 0;
  local_88[0xd] = 0;
  local_88[0xe] = 0;
  local_88[0xf] = 0;
  local_88[8] = 0;
  local_88[9] = 0;
  local_88[10] = 0;
  local_88[0xb] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_a4 = 0;
  local_a8 = 0;
  uVar7 = 0;
  uVar5 = 0;
  uVar3 = 0;
  uVar10 = 0;
  uVar4 = 0;
  uVar11 = 0;
  local_c0 = 0;
  local_bc = crc;
  for (lVar9 = 0; lVar9 + 0x50U < len; lVar9 = lVar9 + 0x28) {
    uVar2 = local_bc ^ *(uint *)((long)buf + lVar9);
    local_c0 = local_c0 ^ *(uint *)((long)buf + lVar9 + 4);
    uVar11 = uVar11 ^ *(uint *)((long)buf + lVar9 + 8);
    uVar4 = uVar4 ^ *(uint *)((long)buf + lVar9 + 0xc);
    uVar10 = uVar2 << 0x11 ^ *(uint *)((long)buf + lVar9 + 0x10) ^ uVar10;
    uVar3 = local_c0 << 0x11 ^ (uVar2 << 0x17 | uVar2 >> 0xf) ^ *(uint *)((long)buf + lVar9 + 0x14)
            ^ uVar3;
    uVar5 = uVar11 << 0x11 ^ (local_c0 << 0x17 | local_c0 >> 0xf) ^ uVar2 << 0x13 ^ uVar2 >> 9 ^
            *(uint *)((long)buf + lVar9 + 0x18) ^ uVar5;
    uVar6 = (local_c0 << 0x13 | uVar2 >> 0xd) ^ local_c0 >> 9 ^
            uVar4 << 0x11 ^ (uVar11 << 0x17 | uVar11 >> 0xf) ^ *(uint *)((long)buf + lVar9 + 0x1c) ^
            uVar7;
    uVar8 = (uVar11 << 0x13 | local_c0 >> 0xd) ^ uVar11 >> 9 ^ (uVar4 << 0x17 | uVar4 >> 0xf) ^
            uVar10 << 0x11 ^ *(uint *)((long)buf + lVar9 + 0x20) ^ local_a8;
    local_a4 = (uVar2 << 0xc | local_a4) ^ uVar4 << 0x13 ^ uVar11 >> 0xd ^ uVar4 >> 9 ^
               (uVar10 << 0x17 | uVar10 >> 0xf) ^ uVar3 << 0x11 ^
               *(uint *)((long)buf + lVar9 + 0x24);
    local_bc = (uVar2 >> 0x14 | local_c0 << 0xc) ^ uVar4 >> 0xd ^ uVar10 << 0x13 ^ uVar10 >> 9 ^
               (uVar3 << 0x17 | uVar3 >> 0xf) ^ uVar5 << 0x11;
    local_c0 = (local_c0 >> 0x14 | uVar11 << 0xc) ^ uVar10 >> 0xd ^ uVar3 << 0x13 ^ uVar3 >> 9 ^
               (uVar5 << 0x17 | uVar5 >> 0xf) ^ uVar6 << 0x11;
    uVar11 = (uVar11 >> 0x14 | uVar4 << 0xc) ^ uVar3 >> 0xd ^ uVar5 << 0x13 ^ uVar5 >> 9 ^
             (uVar6 << 0x17 | uVar6 >> 0xf) ^ uVar8 << 0x11;
    uVar4 = (uVar4 >> 0x14 | uVar10 << 0xc) ^ uVar5 >> 0xd ^ uVar6 << 0x13 ^ uVar6 >> 9 ^
            (uVar8 << 0x17 | uVar8 >> 0xf) ^ local_a4 << 0x11;
    uVar7 = uVar6 >> 0x14 | uVar8 << 0xc;
    uVar10 = (uVar10 >> 0x14 | uVar3 << 0xc) ^ uVar6 >> 0xd ^ uVar8 << 0x13 ^ uVar8 >> 9 ^
             (local_a4 << 0x17 | local_a4 >> 0xf);
    local_a8 = local_a4 << 0xc | uVar8 >> 0x14;
    uVar3 = (uVar3 >> 0x14 | uVar5 << 0xc) ^ uVar8 >> 0xd ^ local_a4 << 0x13 ^ local_a4 >> 9;
    uVar5 = (uVar5 >> 0x14 | uVar6 << 0xc) ^ local_a4 >> 0xd;
    local_a4 = local_a4 >> 0x14;
  }
  memcpy(local_88,(void *)((long)buf + lVar9),len - lVar9);
  local_88[1] = local_88[1] ^ local_c0;
  local_88[0] = local_88[0] ^ local_bc;
  local_88[3] = local_88[3] ^ uVar4;
  local_88[2] = local_88[2] ^ uVar11;
  local_88[5] = local_88[5] ^ uVar3;
  local_88[4] = local_88[4] ^ uVar10;
  local_88[7] = local_88[7] ^ uVar7;
  local_88[6] = local_88[6] ^ uVar5;
  local_88[9] = local_88[9] ^ local_a4;
  local_88[8] = local_88[8] ^ local_a8;
  uVar1 = crc32_braid_internal(0,(uint8_t *)local_88,len - lVar9);
  return uVar1;
}

Assistant:

Z_INTERNAL uint32_t crc32_chorba_small_nondestructive_32bit (uint32_t crc, const uint32_t* buf, size_t len) {
    const uint32_t* input = buf;
    uint32_t final[20] = {0};

    uint32_t next1 = crc;
    crc = 0;
    uint32_t next2 = 0;
    uint32_t next3 = 0;
    uint32_t next4 = 0;
    uint32_t next5 = 0;
    uint32_t next6 = 0;
    uint32_t next7 = 0;
    uint32_t next8 = 0;
    uint32_t next9 = 0;
    uint32_t next10 = 0;

    size_t i = 0;
    for(; i + 80 < len; i += 40) {
        uint32_t in1;
        uint32_t in2;
        uint32_t in3;
        uint32_t in4;
        uint32_t in5;
        uint32_t in6;
        uint32_t in7;
        uint32_t in8;
        uint32_t in9;
        uint32_t in10;

        uint32_t a1, a2, a3, a4, a6, a7;
        uint32_t b1, b2, b3, b4, b6, b7;
        uint32_t c1, c2, c3, c4, c6, c7;
        uint32_t d1, d2, d3, d4, d6, d7;
        uint32_t e1, e2, e3, e4, e6, e7;
        uint32_t f1, f2, f3, f4, f6, f7;
        uint32_t g1, g2, g3, g4, g6, g7;
        uint32_t h1, h2, h3, h4, h6, h7;
        uint32_t i1, i2, i3, i4, i6, i7;
        uint32_t j1, j2, j3, j4, j6, j7;

        uint32_t out1;
        uint32_t out2;
        uint32_t out3;
        uint32_t out4;
        uint32_t out5;
        uint32_t out6;
        uint32_t out7;
        uint32_t out8;
        uint32_t out9;
        uint32_t out10;

        in1 = input[i/sizeof(uint32_t) + 0];
        in2 = input[i/sizeof(uint32_t) + 1];
        in3 = input[i/sizeof(uint32_t) + 2];
        in4 = input[i/sizeof(uint32_t) + 3];
#if BYTE_ORDER == BIG_ENDIAN
        in1 = ZSWAP32(in1);
        in2 = ZSWAP32(in2);
        in3 = ZSWAP32(in3);
        in4 = ZSWAP32(in4);
#endif
        in1 ^= next1;
        in2 ^= next2;
        in3 ^= next3;
        in4 ^= next4;

        a1 = (in1 << 17);
        a2 = (in1 >> 15) ^ (in1 << 23);
        a3 = (in1 >> 9) ^ (in1 << 19);
        a4 = (in1 >> 13);
        a6 = (in1 << 12);
        a7 = (in1 >> 20);

        b1 = (in2 << 17);
        b2 = (in2 >> 15) ^ (in2 << 23);
        b3 = (in2 >> 9) ^ (in2 << 19);
        b4 = (in2 >> 13);
        b6 = (in2 << 12);
        b7 = (in2 >> 20);

        c1 = (in3 << 17);
        c2 = (in3 >> 15) ^ (in3 << 23);
        c3 = (in3 >> 9) ^ (in3 << 19);
        c4 = (in3 >> 13);
        c6 = (in3 << 12);
        c7 = (in3 >> 20);

        d1 = (in4 << 17);
        d2 = (in4 >> 15) ^ (in4 << 23);
        d3 = (in4 >> 9) ^ (in4 << 19);
        d4 = (in4 >> 13);
        d6 = (in4 << 12);
        d7 = (in4 >> 20);

        in5 = input[i/sizeof(uint32_t) + 4];
        in6 = input[i/sizeof(uint32_t) + 5];
        in7 = input[i/sizeof(uint32_t) + 6];
        in8 = input[i/sizeof(uint32_t) + 7];
#if BYTE_ORDER == BIG_ENDIAN
        in5 = ZSWAP32(in5);
        in6 = ZSWAP32(in6);
        in7 = ZSWAP32(in7);
        in8 = ZSWAP32(in8);
#endif
        in5 ^= next5 ^ a1;
        in6 ^= next6 ^ a2 ^ b1;
        in7 ^= next7 ^ a3 ^ b2 ^ c1;
        in8 ^= next8 ^ a4 ^ b3 ^ c2 ^ d1;

        e1 = (in5 << 17);
        e2 = (in5 >> 15) ^ (in5 << 23);
        e3 = (in5 >> 9) ^ (in5 << 19);
        e4 = (in5 >> 13);
        e6 = (in5 << 12);
        e7 = (in5 >> 20);

        f1 = (in6 << 17);
        f2 = (in6 >> 15) ^ (in6 << 23);
        f3 = (in6 >> 9) ^ (in6 << 19);
        f4 = (in6 >> 13);
        f6 = (in6 << 12);
        f7 = (in6 >> 20);

        g1 = (in7 << 17);
        g2 = (in7 >> 15) ^ (in7 << 23);
        g3 = (in7 >> 9) ^ (in7 << 19);
        g4 = (in7 >> 13);
        g6 = (in7 << 12);
        g7 = (in7 >> 20);

        h1 = (in8 << 17);
        h2 = (in8 >> 15) ^ (in8 << 23);
        h3 = (in8 >> 9) ^ (in8 << 19);
        h4 = (in8 >> 13);
        h6 = (in8 << 12);
        h7 = (in8 >> 20);

        in9 = input[i/sizeof(uint32_t) + 8];
        in10 = input[i/sizeof(uint32_t) + 9];
#if BYTE_ORDER == BIG_ENDIAN
        in9 = ZSWAP32(in9);
        in10 = ZSWAP32(in10);
#endif
        in9 ^= next9 ^ b4 ^ c3 ^ d2 ^ e1;
        in10 ^= next10 ^ a6 ^ c4 ^ d3 ^ e2 ^ f1;

        i1 = (in9 << 17);
        i2 = (in9 >> 15) ^ (in9 << 23);
        i3 = (in9 >> 9) ^ (in9 << 19);
        i4 = (in9 >> 13);
        i6 = (in9 << 12);
        i7 = (in9 >> 20);

        j1 = (in10 << 17);
        j2 = (in10 >> 15) ^ (in10 << 23);
        j3 = (in10 >> 9) ^ (in10 << 19);
        j4 = (in10 >> 13);
        j6 = (in10 << 12);
        j7 = (in10 >> 20);

        out1 = a7 ^ b6 ^ d4 ^ e3 ^ f2 ^ g1;
        out2 = b7 ^ c6 ^ e4 ^ f3 ^ g2 ^ h1;
        out3 = c7 ^ d6 ^ f4 ^ g3 ^ h2 ^ i1;
        out4 = d7 ^ e6 ^ g4 ^ h3 ^ i2 ^ j1;
        out5 = e7 ^ f6 ^ h4 ^ i3 ^ j2;
        out6 = f7 ^ g6 ^ i4 ^ j3;
        out7 = g7 ^ h6 ^ j4;
        out8 = h7 ^ i6;
        out9 = i7 ^ j6;
        out10 = j7;

        next1 = out1;
        next2 = out2;
        next3 = out3;
        next4 = out4;
        next5 = out5;
        next6 = out6;
        next7 = out7;
        next8 = out8;
        next9 = out9;
        next10 = out10;

    }
#if BYTE_ORDER == BIG_ENDIAN
    next1 = ZSWAP32(next1);
    next2 = ZSWAP32(next2);
    next3 = ZSWAP32(next3);
    next4 = ZSWAP32(next4);
    next5 = ZSWAP32(next5);
    next6 = ZSWAP32(next6);
    next7 = ZSWAP32(next7);
    next8 = ZSWAP32(next8);
    next9 = ZSWAP32(next9);
    next10 = ZSWAP32(next10);
#endif

    memcpy(final, input+(i/sizeof(uint32_t)), len-i);
    final[0] ^= next1;
    final[1] ^= next2;
    final[2] ^= next3;
    final[3] ^= next4;
    final[4] ^= next5;
    final[5] ^= next6;
    final[6] ^= next7;
    final[7] ^= next8;
    final[8] ^= next9;
    final[9] ^= next10;

    crc = crc32_braid_internal(crc, (uint8_t*) final, len-i);

    return crc;
}